

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

int implementations::scheme::scheme_main(void)

{
  environment *this;
  shared_ptr<implementations::scheme::environment> local_80;
  allocator local_69;
  string local_68;
  shared_ptr<implementations::scheme::environment> local_48;
  undefined1 local_35;
  shared_ptr<implementations::scheme::environment> local_28;
  undefined1 local_18 [8];
  env_p global_env;
  
  this = (environment *)operator_new(0x98);
  local_35 = 1;
  std::shared_ptr<implementations::scheme::environment>::shared_ptr(&local_28,(nullptr_t)0x0);
  environment::environment(this,&local_28);
  local_35 = 0;
  std::shared_ptr<implementations::scheme::environment>::
  shared_ptr<implementations::scheme::environment,void>
            ((shared_ptr<implementations::scheme::environment> *)local_18,this);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_28);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_48,(shared_ptr<implementations::scheme::environment> *)local_18);
  add_globals(&local_48);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"90> ",&local_69);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_80,(shared_ptr<implementations::scheme::environment> *)local_18);
  repl(&local_68,&local_80);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr
            ((shared_ptr<implementations::scheme::environment> *)local_18);
  return 0;
}

Assistant:

int scheme_main()
{
	env_p global_env(new environment()); add_globals(global_env);
	repl("90> ", global_env);
	return 0;
}